

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

OPJ_BOOL opj_tcd_update_tile_data(opj_tcd_t *p_tcd,OPJ_BYTE *p_dest,OPJ_UINT32 p_dest_length)

{
  size_t __n;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  opj_tcd_resolution_t *poVar9;
  OPJ_UINT32 OVar10;
  OPJ_BOOL OVar11;
  opj_image_t *poVar12;
  opj_tcd_resolution_t *poVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  opj_image_comp_t *poVar19;
  uint uVar20;
  opj_tcd_tilecomp_t *poVar21;
  ulong uVar22;
  void *__src;
  bool bVar23;
  int iVar24;
  ulong uVar25;
  long lStack_50;
  
  OVar10 = opj_tcd_get_decoded_tile_size(p_tcd,1);
  OVar11 = 0;
  if (OVar10 <= p_dest_length && OVar10 != 0xffffffff) {
    poVar12 = p_tcd->image;
    poVar21 = p_tcd->tcd_image->tiles->comps;
    poVar19 = poVar12->comps;
    for (uVar20 = 0; uVar20 < poVar12->numcomps; uVar20 = uVar20 + 1) {
      poVar9 = poVar21->resolutions;
      poVar13 = poVar9 + poVar19->resno_decoded;
      if (p_tcd->whole_tile_decoding == 0) {
        uVar3 = poVar13->win_x1;
        uVar7 = poVar13->win_y1;
        uVar4 = poVar13->win_x0;
        uVar8 = poVar13->win_y0;
        uVar25 = CONCAT44(uVar7 - uVar8,uVar3 - uVar4);
        uVar22 = 0;
        lStack_50 = 0x50;
      }
      else {
        uVar1 = poVar13->x1;
        uVar5 = poVar13->y1;
        uVar2 = poVar13->x0;
        uVar6 = poVar13->y0;
        uVar25 = CONCAT44(uVar5 - uVar6,uVar1 - uVar2);
        uVar14 = poVar21->minimum_num_resolutions - 1;
        uVar22 = (ulong)(uint)(poVar9[uVar14].x1 - ((uVar1 - uVar2) + poVar9[uVar14].x0));
        lStack_50 = 0x30;
      }
      iVar15 = ((poVar19->prec >> 3) + 1) - (uint)((poVar19->prec & 7) == 0);
      __src = *(void **)((long)&poVar21->x0 + lStack_50);
      if (iVar15 == 3) {
        iVar15 = 4;
      }
      iVar24 = (int)uVar25;
      iVar16 = (int)(uVar25 >> 0x20);
      if (iVar15 == 1) {
        if (poVar19->sgnd == 0) {
          for (iVar15 = 0; iVar15 != iVar16; iVar15 = iVar15 + 1) {
            lVar17 = uVar22 * -4;
            for (lVar18 = 0; iVar24 != (int)lVar18; lVar18 = lVar18 + 1) {
              p_dest[lVar18] = *(OPJ_BYTE *)((long)__src + lVar18 * 4);
              lVar17 = lVar17 + -4;
            }
            __src = (void *)((long)__src - lVar17);
            p_dest = p_dest + lVar18;
          }
        }
        else {
          for (iVar15 = 0; iVar15 != iVar16; iVar15 = iVar15 + 1) {
            lVar17 = uVar22 * -4;
            for (lVar18 = 0; iVar24 != (int)lVar18; lVar18 = lVar18 + 1) {
              p_dest[lVar18] = *(OPJ_BYTE *)((long)__src + lVar18 * 4);
              lVar17 = lVar17 + -4;
            }
            __src = (void *)((long)__src - lVar17);
            p_dest = p_dest + lVar18;
          }
        }
      }
      else if (iVar15 == 2) {
        if (poVar19->sgnd == 0) {
          for (iVar15 = 0; iVar15 != iVar16; iVar15 = iVar15 + 1) {
            lVar17 = uVar22 * -4;
            for (lVar18 = 0; iVar24 != (int)lVar18; lVar18 = lVar18 + 1) {
              *(undefined2 *)p_dest = *(undefined2 *)((long)__src + lVar18 * 4);
              p_dest = p_dest + 2;
              lVar17 = lVar17 + -4;
            }
            __src = (void *)((long)__src - lVar17);
          }
        }
        else {
          for (iVar15 = 0; iVar15 != iVar16; iVar15 = iVar15 + 1) {
            lVar17 = uVar22 * -4;
            for (lVar18 = 0; iVar24 != (int)lVar18; lVar18 = lVar18 + 1) {
              *(undefined2 *)p_dest = *(undefined2 *)((long)__src + lVar18 * 4);
              p_dest = p_dest + 2;
              lVar17 = lVar17 + -4;
            }
            __src = (void *)((long)__src - lVar17);
          }
        }
      }
      else if (iVar15 == 4) {
        __n = (uVar25 & 0xffffffff) * 4;
        while (bVar23 = iVar16 != 0, iVar16 = iVar16 + -1, bVar23) {
          memcpy(p_dest,__src,__n);
          p_dest = p_dest + __n;
          __src = (void *)((long)__src + (ulong)(uint)((int)uVar22 + iVar24) * 4);
        }
      }
      poVar19 = poVar19 + 1;
      poVar21 = poVar21 + 1;
      poVar12 = p_tcd->image;
    }
    OVar11 = 1;
  }
  return OVar11;
}

Assistant:

OPJ_BOOL opj_tcd_update_tile_data(opj_tcd_t *p_tcd,
                                  OPJ_BYTE * p_dest,
                                  OPJ_UINT32 p_dest_length
                                 )
{
    OPJ_UINT32 i, j, k, l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    opj_tcd_resolution_t * l_res;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_UINT32 l_stride, l_width, l_height;

    l_data_size = opj_tcd_get_decoded_tile_size(p_tcd, OPJ_TRUE);
    if (l_data_size == UINT_MAX || l_data_size > p_dest_length) {
        return OPJ_FALSE;
    }

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;

    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        const OPJ_INT32* l_src_data;
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */
        l_res = l_tilec->resolutions + l_img_comp->resno_decoded;
        if (p_tcd->whole_tile_decoding) {
            l_width = (OPJ_UINT32)(l_res->x1 - l_res->x0);
            l_height = (OPJ_UINT32)(l_res->y1 - l_res->y0);
            l_stride = (OPJ_UINT32)(l_tilec->resolutions[l_tilec->minimum_num_resolutions -
                                                                     1].x1 -
                                    l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x0) - l_width;
            l_src_data = l_tilec->data;
        } else {
            l_width = l_res->win_x1 - l_res->win_x0;
            l_height = l_res->win_y1 - l_res->win_y0;
            l_stride = 0;
            l_src_data = l_tilec->data_win;
        }

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        switch (l_size_comp) {
        case 1: {
            OPJ_CHAR * l_dest_ptr = (OPJ_CHAR *) p_dest;
            const OPJ_INT32 * l_src_ptr = l_src_data;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        *(l_dest_ptr++) = (OPJ_CHAR)(*(l_src_ptr++));
                    }
                    l_src_ptr += l_stride;
                }
            } else {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        *(l_dest_ptr++) = (OPJ_CHAR)((*(l_src_ptr++)) & 0xff);
                    }
                    l_src_ptr += l_stride;
                }
            }

            p_dest = (OPJ_BYTE *)l_dest_ptr;
        }
        break;
        case 2: {
            const OPJ_INT32 * l_src_ptr = l_src_data;
            OPJ_INT16 * l_dest_ptr = (OPJ_INT16 *) p_dest;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        OPJ_INT16 val = (OPJ_INT16)(*(l_src_ptr++));
                        memcpy(l_dest_ptr, &val, sizeof(val));
                        l_dest_ptr ++;
                    }
                    l_src_ptr += l_stride;
                }
            } else {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        OPJ_INT16 val = (OPJ_INT16)((*(l_src_ptr++)) & 0xffff);
                        memcpy(l_dest_ptr, &val, sizeof(val));
                        l_dest_ptr ++;
                    }
                    l_src_ptr += l_stride;
                }
            }

            p_dest = (OPJ_BYTE*) l_dest_ptr;
        }
        break;
        case 4: {
            OPJ_INT32 * l_dest_ptr = (OPJ_INT32 *) p_dest;
            const OPJ_INT32 * l_src_ptr = l_src_data;

            for (j = 0; j < l_height; ++j) {
                memcpy(l_dest_ptr, l_src_ptr, l_width * sizeof(OPJ_INT32));
                l_dest_ptr += l_width;
                l_src_ptr += l_width + l_stride;
            }

            p_dest = (OPJ_BYTE*) l_dest_ptr;
        }
        break;
        }

        ++l_img_comp;
        ++l_tilec;
    }

    return OPJ_TRUE;
}